

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Project.cpp
# Opt level: O2

void __thiscall
Project2D::preparePressureSolving(Project2D *this,SparseMatrix<double,_0,_int> *A,VectorXd *b)

{
  uint uVar1;
  ushort uVar2;
  uint64_t rows;
  unsigned_long uVar3;
  ulong uVar4;
  Project2D *pPVar5;
  unsigned_long *puVar6;
  Scalar *pSVar7;
  double *pdVar8;
  CellLabel *pCVar9;
  ulong uVar10;
  unsigned_short j;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  unsigned_short uVar15;
  StaggeredGrid<double,_unsigned_short> *pSVar16;
  int __numer;
  double extraout_XMM0_Qa;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
  local_88;
  undefined4 local_74;
  ulong local_70;
  ulong local_68;
  unsigned_long local_60;
  VectorXd *local_58;
  Index local_50;
  SparseMatrix<double,_0,_int> *local_48;
  Project2D *local_40;
  Scalar local_38;
  
  rows = ((this->super_Project)._grid)->_activeCells;
  local_58 = b;
  Eigen::SparseMatrix<double,_0,_int>::resize(A,rows,rows);
  Eigen::internal::CompressedStorage<double,_int>::squeeze(&A->m_data);
  local_74 = 5;
  Eigen::DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::Constant
            ((Index)&local_88,(Scalar *)((this->super_Project)._grid)->_activeCells);
  local_48 = A;
  Eigen::SparseMatrix<double,0,int>::
  reserveInnerVectors<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,Eigen::Matrix<int,_1,1,0,_1,1>>>
            ((SparseMatrix<double,0,int> *)A,&local_88);
  Field<double,_unsigned_short>::reset(&((this->super_Project)._grid)->_Adiag);
  Field<double,_unsigned_short>::reset(&((this->super_Project)._grid)->_Ax);
  Field<double,_unsigned_short>::reset(&((this->super_Project)._grid)->_Ay);
  Field<double,_unsigned_short>::reset(&((this->super_Project)._grid)->_Az);
  Field<double,_unsigned_short>::reset(&((this->super_Project)._grid)->_precon);
  uVar14 = 0;
  local_40 = this;
  do {
    pSVar16 = (this->super_Project)._grid;
    if ((pSVar16->_surface)._maxIt <= uVar14) {
      Eigen::SparseMatrix<double,_0,_int>::makeCompressed(local_48);
      return;
    }
    uVar10 = (ulong)(pSVar16->_surface)._Xsize;
    uVar12 = uVar14 % ((pSVar16->_surface)._Ysize * uVar10);
    uVar4 = uVar12 / uVar10;
    uVar12 = uVar12 % uVar10;
    iVar11 = (int)uVar12;
    j = (unsigned_short)uVar4;
    uVar15 = (unsigned_short)uVar12;
    local_70 = uVar4;
    puVar6 = Field<unsigned_long,_unsigned_short>::operator()(&pSVar16->_pressureID,uVar15,j,0);
    uVar3 = *puVar6;
    if (uVar3 != 0) {
      local_50 = uVar3 - 1;
      local_68 = uVar14;
      local_60 = uVar3;
      if (iVar11 != 0) {
        puVar6 = Field<unsigned_long,_unsigned_short>::operator()
                           (&((this->super_Project)._grid)->_pressureID,uVar15 - 1,j,0);
        if (*puVar6 != 0) {
          pSVar7 = Eigen::SparseMatrix<double,_0,_int>::coeffRef(local_48,local_50,*puVar6 - 1);
          *pSVar7 = -1.0;
          pdVar8 = Field<double,_unsigned_short>::operator()
                             (&((this->super_Project)._grid)->_Adiag,uVar15,j,0);
          *pdVar8 = *pdVar8 + 1.0;
        }
      }
      local_38 = (Scalar)CONCAT44(local_38._4_4_,iVar11);
      uVar13 = iVar11 + 1;
      pSVar16 = (this->super_Project)._grid;
      uVar2 = (pSVar16->_surface)._Xsize;
      if (uVar13 < uVar2) {
        puVar6 = Field<unsigned_long,_unsigned_short>::operator()
                           (&pSVar16->_pressureID,(unsigned_short)uVar13,j,0);
        if (*puVar6 == 0) {
          pSVar16 = (this->super_Project)._grid;
          uVar2 = (pSVar16->_surface)._Xsize;
          goto LAB_00113774;
        }
        pSVar7 = Eigen::SparseMatrix<double,_0,_int>::coeffRef(local_48,local_50,*puVar6 - 1);
        *pSVar7 = -1.0;
        uVar15 = SUB82(local_38,0);
        pdVar8 = Field<double,_unsigned_short>::operator()
                           (&((this->super_Project)._grid)->_Adiag,uVar15,j,0);
        this = local_40;
        *pdVar8 = *pdVar8 + 1.0;
        pdVar8 = Field<double,_unsigned_short>::operator()
                           (&((local_40->super_Project)._grid)->_Ax,uVar15,j,0);
        *pdVar8 = -1.0;
      }
      else {
LAB_00113774:
        if (uVar13 < uVar2) {
          pCVar9 = Field<double,_unsigned_short>::label
                             (&pSVar16->_surface,(unsigned_short)uVar13,j,0);
          if ((*pCVar9 & EMPTY) != 0) {
            pdVar8 = Field<double,_unsigned_short>::operator()
                               (&((this->super_Project)._grid)->_Adiag,SUB82(local_38,0),j,0);
            *pdVar8 = *pdVar8 + 1.0;
          }
        }
      }
      uVar13 = (uint)uVar4 & 0xffff;
      if ((uVar4 & 0xffff) != 0) {
        uVar15 = SUB82(local_38,0);
        puVar6 = Field<unsigned_long,_unsigned_short>::operator()
                           (&((this->super_Project)._grid)->_pressureID,uVar15,(short)local_70 - 1,0
                           );
        if (*puVar6 != 0) {
          pSVar7 = Eigen::SparseMatrix<double,_0,_int>::coeffRef(local_48,local_50,*puVar6 - 1);
          *pSVar7 = -1.0;
          pdVar8 = Field<double,_unsigned_short>::operator()
                             (&((this->super_Project)._grid)->_Adiag,uVar15,j,0);
          *pdVar8 = *pdVar8 + 1.0;
        }
      }
      uVar1 = uVar13 + 1;
      pSVar16 = (this->super_Project)._grid;
      uVar2 = (pSVar16->_surface)._Ysize;
      if (uVar1 < uVar2) {
        __numer = local_38._0_4_;
        uVar15 = SUB82(local_38,0);
        puVar6 = Field<unsigned_long,_unsigned_short>::operator()
                           (&pSVar16->_pressureID,uVar15,(unsigned_short)uVar1,0);
        if (*puVar6 == 0) {
          pSVar16 = (local_40->super_Project)._grid;
          uVar2 = (pSVar16->_surface)._Ysize;
          goto LAB_001138e6;
        }
        pSVar7 = Eigen::SparseMatrix<double,_0,_int>::coeffRef(local_48,local_50,*puVar6 - 1);
        pPVar5 = local_40;
        *pSVar7 = -1.0;
        pdVar8 = Field<double,_unsigned_short>::operator()
                           (&((local_40->super_Project)._grid)->_Adiag,uVar15,j,0);
        *pdVar8 = *pdVar8 + 1.0;
        pdVar8 = Field<double,_unsigned_short>::operator()
                           (&((pPVar5->super_Project)._grid)->_Ay,uVar15,j,0);
        *pdVar8 = -1.0;
      }
      else {
LAB_001138e6:
        __numer = local_38._0_4_;
        if (uVar1 < uVar2) {
          uVar15 = SUB82(local_38,0);
          pCVar9 = Field<double,_unsigned_short>::label
                             (&pSVar16->_surface,uVar15,(unsigned_short)uVar1,0);
          if ((*pCVar9 & EMPTY) != 0) {
            pdVar8 = Field<double,_unsigned_short>::operator()
                               (&((local_40->super_Project)._grid)->_Adiag,uVar15,j,0);
            *pdVar8 = *pdVar8 + 1.0;
          }
        }
      }
      this = local_40;
      pSVar16 = (local_40->super_Project)._grid;
      local_38 = (Scalar)(int)(char)('\x04' - ((uVar13 == (pSVar16->_surface)._Ysize - 1) +
                                              ((pSVar16->_surface)._Xsize - 1 == iVar11) +
                                              (iVar11 == 0) + ((uVar4 & 0xffff) == 0)));
      pSVar7 = Eigen::SparseMatrix<double,_0,_int>::coeffRef(local_48,local_50,local_50);
      *pSVar7 = local_38;
      div(this,__numer,(uint)uVar4 & 0xffff);
      (local_58->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      [local_60 - 1] = extraout_XMM0_Qa;
      uVar14 = local_68;
    }
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

void Project2D::preparePressureSolving(
        Eigen::SparseMatrix<double>& A,
        Eigen::VectorXd& b
    )
{
    A.resize(_grid.activeCellsNb(), _grid.activeCellsNb());
    A.data().squeeze();
    A.reserve(Eigen::VectorXi::Constant(_grid.activeCellsNb(), 5));
    _grid._Adiag.reset();
    _grid._Ax.reset();
    _grid._Ay.reset();
    _grid._Az.reset();
    _grid._precon.reset();

    const double scale = 1;
    for (std::uint64_t n = 0; n < _grid._surface.maxIt(); ++n)
    {
        const std::uint64_t xy =
            static_cast<std::uint64_t>(_grid._surface.x()*_grid._surface.y());
        const std::uint64_t m = n % xy;
        const std::uint16_t i = m % _grid._surface.x();
        const std::uint16_t j = m / _grid._surface.x();
        const std::uint16_t k = 0;

        std::uint64_t id = _grid._pressureID(i, j, k);
        if (id > 0)
        {
            const std::uint64_t realID = id-1;
            std::uint64_t neibID = 0;
            if (i > 0 && (neibID = _grid._pressureID(i-1, j, k)) > 0)
            {
                A.coeffRef(realID, neibID-1) = -scale;
                _grid._Adiag(i, j, k) += scale;
            }
            if (i+1 < _grid._surface.x() &&
                    (neibID = _grid._pressureID(i+1, j, k)) > 0)
            {
                A.coeffRef(realID, neibID-1) = -scale;
                _grid._Adiag(i, j, k) += scale;
                _grid._Ax(i, j, k) = -scale;
            }
            else if (i+1 < _grid._surface.x() &&
                    _grid._surface.label(i+1, j, k) & EMPTY)
            {
                _grid._Adiag(i, j, k) += scale;
            }
            if (j > 0 && (neibID = _grid._pressureID(i, j-1, k)) > 0)
            {
                A.coeffRef(realID, neibID-1) = -scale;
                _grid._Adiag(i, j, k) += scale;
            }
            if (j+1 < _grid._surface.y() &&
                    (neibID = _grid._pressureID(i, j+1, k)) > 0)
            {
                A.coeffRef(realID, neibID-1) = -scale;
                _grid._Adiag(i, j, k) += scale;
                _grid._Ay(i, j, k) = -scale;
            }
            else if (j+1 < _grid._surface.y() &&
                    _grid._surface.label(i, j+1, k) & EMPTY)
            {
                _grid._Adiag(i, j, k) += scale;
            }

            std::uint8_t nonSolidNeib = 4;
            if (i == 0)
                nonSolidNeib--;
            if (j == 0)
                nonSolidNeib--;
            if (i == _grid._surface.x()-1)
                nonSolidNeib--;
            if (j == _grid._surface.y()-1)
                nonSolidNeib--;
            A.coeffRef(realID, realID) = nonSolidNeib;
            b.coeffRef(realID) = div(i, j, k);
        }
    }
    A.makeCompressed();
}